

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
ObjectArrayInObject_SaveObjectArrayInObject_Test::~ObjectArrayInObject_SaveObjectArrayInObject_Test
          (ObjectArrayInObject_SaveObjectArrayInObject_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectArrayInObject, SaveObjectArrayInObject) {
	stringstream ss;
	obj_array_var2 v;
	v.val1 = 1;
	v.val2 = 1.1f;
	v.val3.resize(1);
	v.val3[0].val1 = 1;
	v.val3[0].val2 = 1.1f;
	EXPECT_TRUE(JSON_OK == save_object_to_stream(v, ss));
	EXPECT_TRUE(ss.str() == "{\n"
							"	\"val1\": 1,\n"
							"	\"val2\": 1.1,\n"
							"	\"val3\": [{\n"
							"			\"val1\": 1,\n"
							"			\"val2\": 1.1\n"
							"		}]\n"
							"}\n");
}